

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
slang::SmallVectorBase<slang::SVInt>::reallocateTo
          (SmallVectorBase<slang::SVInt> *this,size_type newCapacity)

{
  SVInt *__last;
  EVP_PKEY_CTX *ctx;
  SVInt *in_RSI;
  SmallVectorBase<slang::SVInt> *in_RDI;
  pointer newData;
  
  __last = (SVInt *)operator_new(0x5925e6);
  begin(in_RDI);
  ctx = (EVP_PKEY_CTX *)end(in_RDI);
  std::uninitialized_move<slang::SVInt*,slang::SVInt*>(in_RSI,__last,(SVInt *)in_RDI);
  cleanup(in_RDI,ctx);
  in_RDI->cap = (size_type)in_RSI;
  in_RDI->data_ = __last;
  return;
}

Assistant:

void reallocateTo(size_type newCapacity) {
        auto newData = (pointer)::operator new(newCapacity * sizeof(T));
        std::uninitialized_move(begin(), end(), newData);

        cleanup();
        cap = newCapacity;
        data_ = newData;
    }